

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall
wasm::DataFlow::Graph::mergeBlock
          (Graph *this,
          vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
          *localses,Locals *out)

{
  pointer pvVar1;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *locals;
  pointer __args;
  Graph *local_58;
  Locals *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_> states
  ;
  
  auStack_48 = (undefined1  [8])0x0;
  states.
  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  states.
  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __args = (localses->
           super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (localses->
           super__Vector_base<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = out;
  if (__args != pvVar1) {
    do {
      local_58 = this;
      std::vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
      ::
      emplace_back<std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>&,wasm::DataFlow::Node*>
                ((vector<wasm::DataFlow::Graph::FlowState,std::allocator<wasm::DataFlow::Graph::FlowState>>
                  *)auStack_48,__args,(Node **)&local_58);
      __args = __args + 1;
    } while (__args != pvVar1);
  }
  merge(this,(vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
              *)auStack_48,local_50);
  std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>::
  ~vector((vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           *)auStack_48);
  return;
}

Assistant:

void mergeBlock(std::vector<Locals>& localses, Locals& out) {
    // TODO: conditions
    std::vector<FlowState> states;
    for (auto& locals : localses) {
      states.emplace_back(locals, &bad);
    }
    merge(states, out);
  }